

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void json::Json::nextRecord(Object *object,Node *RS)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  Production *pPVar3;
  const_reference pvVar4;
  const_reference this;
  Token *pTVar5;
  JsonError *pJVar6;
  size_type sVar7;
  Node *nextRs;
  string local_2b0;
  bool local_289;
  double dStack_288;
  bool b;
  double d;
  int64_t i;
  string local_270;
  Array local_250;
  Object local_230;
  int local_1f4;
  stringstream local_1f0 [4];
  TokenId tokenType;
  stringstream s;
  Node *uv;
  string name;
  Node *V;
  Node *str;
  Node *R;
  Node *RS_local;
  Object *object_local;
  
  pPVar3 = parser::Node::getProduction(RS);
  pvVar4 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar3->nodes,0);
  pPVar3 = parser::Node::getProduction(pvVar4);
  this = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar3->nodes,0);
  pPVar3 = parser::Node::getProduction(pvVar4);
  name.field_2._8_8_ =
       std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar3->nodes,2);
  pTVar5 = parser::Node::getToken(this);
  std::__cxx11::string::string((string *)&uv,(string *)&pTVar5->value);
  pPVar3 = parser::Node::getProduction((Node *)name.field_2._8_8_);
  pvVar4 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar3->nodes,0);
  pTVar5 = parser::Node::getToken(pvVar4);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1f0,(string *)&pTVar5->value,_Var2);
  pTVar5 = parser::Node::getToken(pvVar4);
  local_1f4 = pTVar5->tokenId;
  bVar1 = parser::Node::isProduction(pvVar4);
  if (bVar1) {
    pPVar3 = parser::Node::getProduction(pvVar4);
    if (pPVar3->nonTerminal == 2) {
      createObject(&local_230,pvVar4);
      Object::operator()(object,(string *)&uv,&local_230);
      Object::~Object(&local_230);
    }
    else {
      pPVar3 = parser::Node::getProduction(pvVar4);
      if (pPVar3->nonTerminal != 3) {
        i._6_1_ = 1;
        pJVar6 = (JsonError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"invalid token type",(allocator<char> *)((long)&i + 7));
        JsonError::JsonError(pJVar6,&local_270);
        i._6_1_ = 0;
        __cxa_throw(pJVar6,&JsonError::typeinfo,JsonError::~JsonError);
      }
      createArray(&local_250,pvVar4);
      Object::operator()(object,(string *)&uv,&local_250);
      Array::~Array(&local_250);
    }
  }
  else if (local_1f4 == 6) {
    d = 0.0;
    std::istream::operator>>(local_1f0,(long *)&d);
    Object::operator()(object,(string *)&uv,(int64_t)d);
  }
  else if (local_1f4 == 8) {
    pTVar5 = parser::Node::getToken(pvVar4);
    Object::operator()(object,(string *)&uv,&pTVar5->value);
  }
  else if (local_1f4 == 7) {
    dStack_288 = 0.0;
    std::istream::operator>>(local_1f0,&stack0xfffffffffffffd78);
    Object::operator()(object,(string *)&uv,dStack_288);
  }
  else {
    if (local_1f4 != 9) {
      nextRs._6_1_ = 1;
      pJVar6 = (JsonError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"invalid token type",(allocator<char> *)((long)&nextRs + 7));
      JsonError::JsonError(pJVar6,&local_2b0);
      nextRs._6_1_ = 0;
      __cxa_throw(pJVar6,&JsonError::typeinfo,JsonError::~JsonError);
    }
    local_289 = false;
    std::istream::operator>>(local_1f0,&local_289);
    Object::operator()(object,(string *)&uv,(bool)(local_289 & 1));
  }
  pPVar3 = parser::Node::getProduction(RS);
  sVar7 = std::vector<parser::Node,_std::allocator<parser::Node>_>::size(&pPVar3->nodes);
  if (1 < sVar7) {
    pPVar3 = parser::Node::getProduction(RS);
    pvVar4 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar3->nodes,2);
    nextRecord(object,pvVar4);
  }
  std::__cxx11::stringstream::~stringstream(local_1f0);
  std::__cxx11::string::~string((string *)&uv);
  return;
}

Assistant:

static void nextRecord(Object& object, parser::Node const& RS) {
            parser::Node const& R = RS.getProduction().nodes.at(0);

            parser::Node const& str = R.getProduction().nodes.at(0);
            parser::Node const& V = R.getProduction().nodes.at(2);

            std::string name = str.getToken().value;

            parser::Node const& uv = V.getProduction().nodes.at(0);

            std::stringstream s(uv.getToken().value);
            lexer::TokenId tokenType = uv.getToken().tokenId;

            if (uv.isProduction()) {
                if (uv.getProduction().nonTerminal == rules::Object) {
                    object(name, createObject(uv));
                } else if (uv.getProduction().nonTerminal == rules::Array) {
                    object(name, createArray(uv));
                } else {
                    throw JsonError("invalid token type");
                }
            } else {
                if (tokenType == rules::Integer) {
                    int64_t i = 0;
                    s >> i;
                    object(name, i);
                } else if (tokenType == rules::String) {
                    object(name, uv.getToken().value);
                } else if (tokenType == rules::Float) {
                    double d = 0;
                    s >> d;
                    object(name, d);
                } else if (tokenType == rules::Bool) {
                    bool b = false;
                    s >> b;
                    object(name, b);
                } else {
                    throw JsonError("invalid token type");
                }
            }

            if (RS.getProduction().nodes.size() > 1) {
                parser::Node const& nextRs = RS.getProduction().nodes.at(2);
                nextRecord(object, nextRs);
            }
        }